

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# findfunction.cpp
# Opt level: O3

int node_width(string *name_node,datanode *node,string *type_name)

{
  size_t __n;
  pointer pcVar1;
  int iVar2;
  long lVar3;
  string *psVar4;
  long lVar5;
  string name_node_1;
  
  lVar3 = (long)nodepointer;
  if (0 < lVar3) {
    __n = name_node->_M_string_length;
    lVar5 = 0;
    do {
      if (*(size_t *)((long)&(node->name)._M_string_length + lVar5) == __n) {
        if (__n == 0) {
LAB_0010606d:
          return *(int *)((long)&node->width + lVar5);
        }
        iVar2 = bcmp(*(void **)((long)&(node->name)._M_dataplus._M_p + lVar5),
                     (name_node->_M_dataplus)._M_p,__n);
        if (iVar2 == 0) goto LAB_0010606d;
      }
      lVar5 = lVar5 + 0x68;
    } while (lVar3 * 0x68 - lVar5 != 0);
  }
  std::__cxx11::string::compare((char *)name_node);
  std::__cxx11::string::compare((char *)name_node);
  std::__cxx11::string::compare((char *)name_node);
  std::__cxx11::string::compare((char *)name_node);
  std::__cxx11::string::compare((char *)name_node);
  std::__cxx11::string::compare((char *)name_node);
  psVar4 = (string *)__cxa_allocate_exception(0x20);
  *(string **)psVar4 = psVar4 + 0x10;
  pcVar1 = (name_node->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>(psVar4,pcVar1,pcVar1 + name_node->_M_string_length);
  __cxa_throw(psVar4,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
}

Assistant:

int node_width(string name_node, struct datanode *node, string type_name)	//tyoe_namme is passed to just output it in case of error
 {
	 int l = 0;
		 for (int i = 0; i < nodepointer; i++)
		 {
			 if (node[i].name == name_node)
			 {
				 return node[i].width;
			 }
		 }
		 
		 if (name_node != "gtn" && name_node !="ltn" && name_node!="eqt" && name_node != "Clk" && name_node!="Rst" && name_node !="1") {
			 try {
				 throw (name_node);
			 }
			 catch (string name_node) {
				 cout << " Node : "<<name_node<<" Not Declared of type "<<type_name;
			 }
		 }
		  
		
 }